

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

bool __thiscall AllDiffBoundsImp<4>::filterlower(AllDiffBoundsImp<4> *this)

{
  int i;
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  IntVar *pIVar5;
  bool bVar6;
  int k;
  int i_00;
  int iVar7;
  uint uVar8;
  Lit LVar9;
  int iVar10;
  long v;
  long lVar11;
  Lit *pLVar12;
  interval *piVar13;
  int l_2;
  long lVar14;
  int i_01;
  int l_1;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int *piVar21;
  int *piVar22;
  int iVar23;
  int l;
  anon_union_8_2_743a5d44_for_Reason_0 local_98;
  interval *piVar15;
  
  piVar22 = this->bounds;
  piVar2 = this->t;
  piVar3 = this->h;
  piVar21 = this->d;
  piVar4 = this->bucket;
  for (lVar16 = 1; lVar16 <= (long)this->nb + 1; lVar16 = lVar16 + 1) {
    iVar10 = piVar22[lVar16];
    iVar20 = (int)lVar16 + -1;
    piVar3[lVar16] = iVar20;
    piVar2[lVar16] = iVar20;
    piVar21[lVar16] = iVar10 - piVar22[lVar16 + -1];
    piVar4[lVar16] = -1;
  }
  lVar16 = 0;
  do {
    iVar10 = this->sz;
    if (iVar10 <= lVar16) {
      return true;
    }
    piVar13 = this->iv;
    piVar2 = this->maxsorted;
    iVar20 = piVar2[lVar16];
    i = piVar13[iVar20].minrank;
    iVar1 = piVar13[iVar20].maxrank;
    piVar3 = this->t;
    i_00 = pathmax(piVar3,i);
    iVar19 = piVar3[i_00];
    piVar4 = this->bucket;
    piVar13[iVar20].next = piVar4[i_00];
    piVar4[i_00] = piVar2[lVar16];
    piVar21 = piVar21 + i_00;
    *piVar21 = *piVar21 + -1;
    if (*piVar21 == 0) {
      piVar3[i_00] = i_00 + 1;
      i_00 = pathmax(piVar3,i_00);
      piVar3[i_00] = iVar19;
    }
    iVar20 = i + 1;
    while (iVar20 != i_00) {
      iVar7 = piVar3[iVar20];
      piVar3[iVar20] = i_00;
      iVar20 = iVar7;
    }
    if (i < this->h[i]) {
      iVar7 = pathmax(this->h,(int)this);
      lVar17 = (long)iVar7;
      iVar20 = piVar22[lVar17];
      v = (long)iVar20;
      if (so.lazy == true) {
        iVar18 = piVar22[i];
        lVar11 = lVar17;
        iVar23 = iVar20;
        while (iVar18 < iVar23) {
          piVar15 = (interval *)(piVar4 + lVar11);
          while (lVar14 = (long)piVar15->next, -1 < lVar14) {
            piVar15 = piVar13 + lVar14;
            if (piVar13[lVar14].min < iVar18) {
              iVar18 = piVar13[lVar14].min;
            }
          }
          lVar14 = lVar11 + -1;
          lVar11 = lVar11 + -1;
          iVar23 = piVar22[lVar14];
        }
        local_98._pt = Reason_new((iVar20 - iVar18) * 2 + 3);
        pIVar5 = this->x[this->maxsorted[lVar16]].var;
        uVar8 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])
                          (pIVar5,(long)iVar18 - (long)this->x[this->maxsorted[lVar16]].b,2);
        pLVar12 = Clause::operator[](local_98._pt,1);
        pLVar12->x = uVar8 ^ 1;
        iVar23 = 3;
        for (; piVar22 = this->bounds, iVar18 < piVar22[lVar17]; lVar17 = lVar17 + -1) {
          piVar13 = (interval *)(this->bucket + lVar17);
          while (lVar11 = (long)piVar13->next, -1 < lVar11) {
            pIVar5 = this->x[lVar11].var;
            uVar8 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar5,(long)iVar18 - (long)this->x[lVar11].b,2);
            i_01 = iVar23 + 1;
            pLVar12 = Clause::operator[](local_98._pt,iVar23);
            pLVar12->x = uVar8 ^ 1;
            pIVar5 = this->x[lVar11].var;
            uVar8 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar5,(v + -1) - (long)this->x[lVar11].b,3);
            iVar23 = iVar23 + 2;
            pLVar12 = Clause::operator[](local_98._pt,i_01);
            pLVar12->x = uVar8 ^ 1;
            piVar13 = this->iv + lVar11;
          }
        }
      }
      else {
        local_98._pt = (Clause *)0x0;
      }
      if (sat.assigns.data[(uint)(this->b).v] == '\0') {
        pIVar5 = this->x[this->maxsorted[lVar16]].var;
        lVar17 = (long)this->x[this->maxsorted[lVar16]].b;
        if ((pIVar5->max).v + lVar17 < v) {
          iVar10 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xd])(pIVar5,v - lVar17,2);
          pLVar12 = Clause::operator[]((Clause *)local_98,2);
          pLVar12->x = iVar10;
          bVar6 = BoolView::setVal(&this->b,false,(Reason)local_98);
          return bVar6;
        }
      }
      else {
        LVar9 = BoolView::getValLit(&this->b);
        pLVar12 = Clause::operator[]((Clause *)local_98,2);
        pLVar12->x = LVar9.x;
        bVar6 = IntView<4>::setMin(this->x + this->maxsorted[lVar16],v,(Reason)local_98,true);
        if (!bVar6) {
          return iVar10 <= lVar16;
        }
        piVar21 = this->maxsorted;
        this->iv[piVar21[lVar16]].min = iVar20;
        iVar10 = piVar21[lVar16];
        if (v < (long)this->x[iVar10].b + (long)((this->x[iVar10].var)->min).v) {
          Propagator::pushInQueue(&this->super_Propagator);
        }
        piVar21 = this->h;
        while (i != iVar7) {
          iVar10 = piVar21[i];
          piVar21[i] = iVar7;
          i = iVar10;
        }
        piVar22 = this->bounds;
      }
    }
    piVar21 = this->d;
    if (piVar21[i_00] == piVar22[i_00] - piVar22[iVar1]) {
      piVar2 = this->h;
      iVar19 = iVar19 + -1;
      iVar10 = piVar2[iVar1];
      while (iVar10 != iVar19) {
        iVar20 = piVar2[iVar10];
        piVar2[iVar10] = iVar1;
        iVar10 = iVar20;
      }
      piVar2[iVar1] = iVar19;
    }
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

bool filterlower() {
		int i;
		int j;
		int w;
		int z;

		// fprintf(stderr, "AllDiffBounds::filterlower()\n");
		for (i = 1; i <= nb + 1; i++) {
			d[i] = bounds[i] - bounds[t[i] = h[i] = i - 1];
			bucket[i] = -1;  // this could perhaps be avoided
		}
		for (i = 0; i < sz; i++) {  // visit intervals in increasing max order
			const int minrank = iv[maxsorted[i]].minrank;
			const int maxrank = iv[maxsorted[i]].maxrank;
			// fprintf(stderr, "var %d [%d, %d)\n", maxsorted[i], bounds[minrank], bounds[maxrank]);
			j = t[z = pathmax(t, minrank + 1)];
			iv[maxsorted[i]].next = bucket[z];
			bucket[z] = maxsorted[i];
			if (--d[z] == 0) {
				t[z = pathmax(t, t[z] = z + 1)] = j;
			}
			pathset(t, minrank + 1, z, z);  // path compression
			// if (d[z] < bounds[z]-bounds[maxrank]) return false; // no solution
			if (h[minrank] > minrank) {
				Clause* r = nullptr;
				const int hall_max = bounds[w = pathmax(h, h[minrank])];
				if (so.lazy) {
					int hall_min = bounds[minrank];
					// here both k and hall_min are decreasing, stop when k catches up
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							hall_min = std::min(hall_min, iv[l].min);
						}
					}
					// fprintf(stderr, "  in hall [%d, %d):\n", hall_min, hall_max);
					r = Reason_new(3 + (hall_max - hall_min) * 2);
					(*r)[1] = ~x[maxsorted[i]].getLit(hall_min, LR_GE);
					int m = 3;
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							// fprintf(stderr, "    var %d [%d, %d)\n", l, iv[l].min, iv[l].max);
							(*r)[m++] = ~x[l].getLit(hall_min, LR_GE);
							(*r)[m++] = ~x[l].getLit(hall_max - 1, LR_LE);
						}
					}
					assert(m == 3 + (hall_max - hall_min) * 2);
				}
				if (b.isFixed()) {
					assert(b.isTrue());
					(*r)[2] = b.getValLit();
					if (!x[maxsorted[i]].setMin(hall_max, r)) {
						// fprintf(stderr, "  failure\n");
						return false;
					}
					iv[maxsorted[i]].min = hall_max;
					if (x[maxsorted[i]].getMin() > hall_max) {
						// fprintf(stderr, "  hole, var %d [%d, %d)\n", maxsorted[i],
						// static_cast<int>(x[maxsorted[i]].getMin()), iv[maxsorted[i]].max);
						pushInQueue();  // hole in domain
					}
					pathset(h, minrank, w, w);  // path compression
				} else {
					if (x[maxsorted[i]].getMax() < hall_max) {
						(*r)[2] = x[maxsorted[i]].getLit(hall_max, LR_GE);
						return b.setVal(false, r);
					}
				}
			}
			if (d[z] == bounds[z] - bounds[maxrank]) {
				// fprintf(stderr, "  new hall [%d, %d)\n", bounds[j], bounds[maxrank]);
				pathset(h, h[maxrank], j - 1, maxrank);  // mark hall interval
				h[maxrank] = j - 1;
			}
		}
		return true;
	}